

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_short,unsigned_short,duckdb::GreaterThan,false,false>
                (unsigned_short *ldata,unsigned_short *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  idx_t iVar7;
  sel_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (false_sel != (SelectionVector *)0x0 && true_sel != (SelectionVector *)0x0) {
    iVar7 = SelectFlatLoop<unsigned_short,unsigned_short,duckdb::GreaterThan,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
    return iVar7;
  }
  uVar1 = count + 0x3f;
  if (true_sel == (SelectionVector *)0x0) {
    if (uVar1 < 0x40) {
      lVar11 = 0;
    }
    else {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      lVar11 = 0;
      uVar14 = 0;
      uVar15 = 0;
      do {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar9 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar9 = count;
          }
LAB_0148088f:
          uVar13 = uVar15;
          if (uVar15 < uVar9) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              uVar12 = uVar15;
              if (psVar5 != (sel_t *)0x0) {
                uVar12 = (ulong)psVar5[uVar15];
              }
              uVar2 = rdata[uVar15];
              uVar3 = ldata[uVar15];
              psVar6[lVar11] = (sel_t)uVar12;
              lVar11 = (lVar11 + 1) - (ulong)(uVar2 < uVar3);
              uVar15 = uVar15 + 1;
              uVar13 = uVar9;
            } while (uVar9 != uVar15);
          }
        }
        else {
          uVar12 = puVar4[uVar14];
          uVar9 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar9 = count;
          }
          if (uVar12 == 0xffffffffffffffff) goto LAB_0148088f;
          uVar13 = uVar9;
          if (uVar12 == 0) {
            if (uVar15 < uVar9) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                uVar12 = uVar15;
                if (psVar5 != (sel_t *)0x0) {
                  uVar12 = (ulong)psVar5[uVar15];
                }
                psVar6[lVar11] = (sel_t)uVar12;
                lVar11 = lVar11 + 1;
                uVar15 = uVar15 + 1;
              } while (uVar9 != uVar15);
            }
          }
          else {
            uVar13 = uVar15;
            if (uVar15 < uVar9) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              uVar10 = 0;
              do {
                if (psVar5 == (sel_t *)0x0) {
                  sVar8 = (int)uVar15 + (int)uVar10;
                }
                else {
                  sVar8 = psVar5[uVar15 + uVar10];
                }
                if ((uVar12 >> (uVar10 & 0x3f) & 1) == 0) {
                  uVar13 = 1;
                }
                else {
                  uVar13 = (ulong)(ldata[uVar15 + uVar10] <= rdata[uVar15 + uVar10]);
                }
                psVar6[lVar11] = sVar8;
                lVar11 = lVar11 + uVar13;
                uVar10 = uVar10 + 1;
                uVar13 = uVar9;
              } while ((uVar15 - uVar9) + uVar10 != 0);
            }
          }
        }
        uVar14 = uVar14 + 1;
        uVar15 = uVar13;
      } while (uVar14 != uVar1 >> 6);
    }
    iVar7 = count - lVar11;
  }
  else if (uVar1 < 0x40) {
    iVar7 = 0;
  }
  else {
    puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    uVar14 = 0;
    uVar15 = 0;
    do {
      if (puVar4 == (unsigned_long *)0x0) {
        uVar9 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar9 = count;
        }
LAB_014807bc:
        uVar13 = uVar15;
        if (uVar15 < uVar9) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          do {
            uVar12 = uVar15;
            if (psVar5 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar5[uVar15];
            }
            uVar2 = rdata[uVar15];
            uVar3 = ldata[uVar15];
            psVar6[iVar7] = (sel_t)uVar12;
            iVar7 = iVar7 + (uVar2 < uVar3);
            uVar15 = uVar15 + 1;
            uVar13 = uVar9;
          } while (uVar9 != uVar15);
        }
      }
      else {
        uVar12 = puVar4[uVar14];
        uVar9 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar9 = count;
        }
        uVar13 = uVar9;
        if (uVar12 != 0) {
          if (uVar12 == 0xffffffffffffffff) goto LAB_014807bc;
          uVar13 = uVar15;
          if (uVar15 < uVar9) {
            psVar5 = sel->sel_vector;
            psVar6 = true_sel->sel_vector;
            uVar10 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar8 = (int)uVar15 + (int)uVar10;
              }
              else {
                sVar8 = psVar5[uVar15 + uVar10];
              }
              if ((uVar12 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = (ulong)(rdata[uVar15 + uVar10] < ldata[uVar15 + uVar10]);
              }
              psVar6[iVar7] = sVar8;
              iVar7 = iVar7 + uVar13;
              uVar10 = uVar10 + 1;
              uVar13 = uVar9;
            } while ((uVar15 - uVar9) + uVar10 != 0);
          }
        }
      }
      uVar14 = uVar14 + 1;
      uVar15 = uVar13;
    } while (uVar14 != uVar1 >> 6);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}